

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

locale booster::locale::impl_posix::create_parsing_impl<char>
                 (locale *in,shared_ptr<__locale_struct_*> *lc)

{
  ctype_posix<char> *this;
  base_num_parse<char> *this_00;
  locale *in_RDX;
  locale *in_RSI;
  ctype_posix<char> *in_RDI;
  size_t unaff_retaddr;
  locale_t in_stack_00000008;
  num_punct_posix<char> *in_stack_00000010;
  locale *tmp;
  shared_ptr<__locale_struct_*> *in_stack_ffffffffffffff58;
  locale *this_01;
  __shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff60;
  shared_ptr<__locale_struct_*> *lc_00;
  ctype_posix<char> *__f;
  locale local_58;
  undefined1 local_49;
  shared_ptr<__locale_struct_*> local_48;
  locale local_38 [3];
  undefined1 local_19;
  
  local_19 = 0;
  __f = in_RDI;
  operator_new(0x78);
  std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_ffffffffffffff60);
  num_punct_posix<char>::num_punct_posix(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::locale::locale<booster::locale::impl_posix::num_punct_posix<char>>
            (in_RDX,in_RSI,(num_punct_posix<char> *)__f);
  this = (ctype_posix<char> *)operator_new(0x250);
  local_49 = 1;
  lc_00 = &local_48;
  std::shared_ptr<__locale_struct_*>::shared_ptr
            ((shared_ptr<__locale_struct_*> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  ctype_posix<char>::ctype_posix(this,lc_00);
  local_49 = 0;
  std::locale::locale<booster::locale::impl_posix::ctype_posix<char>>(in_RDX,in_RSI,__f);
  this_01 = local_38;
  std::locale::operator=((locale *)in_RDI,this_01);
  std::locale::~locale(this_01);
  std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x287567);
  this_00 = (base_num_parse<char> *)operator_new(0x10);
  util::base_num_parse<char>::base_num_parse(this_00,(size_t)this_01);
  std::locale::locale<booster::locale::util::base_num_parse<char>>
            (in_RDX,in_RSI,(base_num_parse<char> *)__f);
  std::locale::operator=((locale *)in_RDI,&local_58);
  std::locale::~locale(&local_58);
  return (locale)(_Impl *)__f;
}

Assistant:

std::locale create_parsing_impl(std::locale const &in,booster::shared_ptr<locale_t> lc)
{
    std::locale tmp = std::locale(in,new num_punct_posix<CharType>(*lc));
    tmp = std::locale(tmp,new ctype_posix<CharType>(lc));
    tmp = std::locale(tmp,new util::base_num_parse<CharType>());
    return tmp;
}